

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DOMNodeImpl::isEqualNode(DOMNodeImpl *this,DOMNode *arg)

{
  short sVar1;
  short sVar2;
  DOMNode *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  short *psVar7;
  short *psVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (arg == (DOMNode *)0x0) {
    return false;
  }
  pDVar3 = this->fContainingNode;
  if (pDVar3 == arg) {
    return true;
  }
  iVar5 = (*arg->_vptr_DOMNode[4])(arg);
  iVar6 = (*pDVar3->_vptr_DOMNode[4])(pDVar3);
  if (iVar5 != iVar6) {
    return false;
  }
  iVar5 = (*pDVar3->_vptr_DOMNode[2])(pDVar3);
  psVar7 = (short *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*arg->_vptr_DOMNode[2])(arg);
  psVar8 = (short *)CONCAT44(extraout_var_00,iVar5);
  if (psVar7 != psVar8) {
    if (psVar8 == (short *)0x0 || psVar7 == (short *)0x0) {
      if (psVar7 == (short *)0x0) {
        if (psVar8 == (short *)0x0) goto LAB_002722fb;
        goto LAB_002722f1;
      }
      sVar1 = *psVar7;
      if ((psVar8 != (short *)0x0) && (sVar1 == 0)) goto LAB_002722f1;
    }
    else {
      while (sVar1 = *psVar7, sVar1 != 0) {
        psVar7 = psVar7 + 1;
        sVar2 = *psVar8;
        psVar8 = psVar8 + 1;
        if (sVar1 != sVar2) {
          return false;
        }
      }
LAB_002722f1:
      sVar1 = *psVar8;
    }
    if (sVar1 != 0) {
      return false;
    }
  }
LAB_002722fb:
  iVar5 = (*pDVar3->_vptr_DOMNode[0x18])(pDVar3);
  psVar7 = (short *)CONCAT44(extraout_var_01,iVar5);
  iVar5 = (*arg->_vptr_DOMNode[0x18])(arg);
  psVar8 = (short *)CONCAT44(extraout_var_02,iVar5);
  if (psVar7 != psVar8) {
    if (psVar8 == (short *)0x0 || psVar7 == (short *)0x0) {
      if (psVar7 == (short *)0x0) {
        if (psVar8 == (short *)0x0) goto LAB_0027237b;
        goto LAB_00272371;
      }
      sVar1 = *psVar7;
      if ((psVar8 != (short *)0x0) && (sVar1 == 0)) goto LAB_00272371;
    }
    else {
      while (sVar1 = *psVar7, sVar1 != 0) {
        psVar7 = psVar7 + 1;
        sVar2 = *psVar8;
        psVar8 = psVar8 + 1;
        if (sVar1 != sVar2) {
          return false;
        }
      }
LAB_00272371:
      sVar1 = *psVar8;
    }
    if (sVar1 != 0) {
      return false;
    }
  }
LAB_0027237b:
  iVar5 = (*pDVar3->_vptr_DOMNode[0x16])(pDVar3);
  psVar7 = (short *)CONCAT44(extraout_var_03,iVar5);
  iVar5 = (*arg->_vptr_DOMNode[0x16])(arg);
  psVar8 = (short *)CONCAT44(extraout_var_04,iVar5);
  if (psVar7 == psVar8) goto LAB_002723f0;
  if (psVar8 == (short *)0x0 || psVar7 == (short *)0x0) {
    if (psVar7 == (short *)0x0) {
      if (psVar8 == (short *)0x0) goto LAB_002723f0;
      goto LAB_002723ea;
    }
    sVar1 = *psVar7;
    if ((psVar8 != (short *)0x0) && (sVar1 == 0)) goto LAB_002723ea;
  }
  else {
    while (sVar1 = *psVar7, sVar1 != 0) {
      psVar7 = psVar7 + 1;
      sVar2 = *psVar8;
      psVar8 = psVar8 + 1;
      if (sVar1 != sVar2) {
        return false;
      }
    }
LAB_002723ea:
    sVar1 = *psVar8;
  }
  if (sVar1 != 0) {
    return false;
  }
LAB_002723f0:
  iVar5 = (*pDVar3->_vptr_DOMNode[0x17])(pDVar3);
  iVar6 = (*arg->_vptr_DOMNode[0x17])(arg);
  bVar4 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_05,iVar5),
                            (XMLCh *)CONCAT44(extraout_var_06,iVar6));
  if (!bVar4) {
    return false;
  }
  iVar5 = (*pDVar3->_vptr_DOMNode[3])(pDVar3);
  iVar6 = (*arg->_vptr_DOMNode[3])(arg);
  bVar4 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar5),
                            (XMLCh *)CONCAT44(extraout_var_08,iVar6));
  return bVar4;
}

Assistant:

bool DOMNodeImpl::isEqualNode(const DOMNode* arg) const
{
    if (!arg)
        return false;

    if (isSameNode(arg)) {
        return true;
    }

    const DOMNode* thisNode = getContainingNode();

    if (arg->getNodeType() != thisNode->getNodeType()) {
        return false;
    }

    // the compareString will check null string as well
    if (!XMLString::equals(thisNode->getNodeName(), arg->getNodeName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getLocalName(),arg->getLocalName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNamespaceURI(), arg->getNamespaceURI())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getPrefix(), arg->getPrefix())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNodeValue(), arg->getNodeValue())) {
        return false;
    }

    return true;
}